

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_extension.cpp
# Opt level: O0

void __thiscall dlib::thread_pool_implementation::shutdown_pool(thread_pool_implementation *this)

{
  array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
  *paVar1;
  bool bVar2;
  array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
  *paVar3;
  iterator ptVar4;
  array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
  *__stat_loc;
  array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_RDI;
  task_state_type *task;
  iterator __end1_1;
  iterator __begin1_1;
  array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
  *__range1_1;
  thread *t;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  unsigned_long i;
  bool found_task;
  auto_mutex M;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  task_state_type *in_stack_ffffffffffffff60;
  iterator local_70;
  task_state_type *in_stack_ffffffffffffffa0;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_> local_50
  ;
  task_state_type **local_48;
  array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
  *local_30;
  byte local_21;
  
  __stat_loc = in_RDI + 2;
  auto_mutex::auto_mutex
            ((auto_mutex *)in_stack_ffffffffffffff60,
             (mutex *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  local_21 = 1;
  do {
    if ((local_21 & 1) == 0) {
      *(undefined1 *)&in_RDI[4].pos = 1;
      signaler::broadcast((signaler *)0x29c780);
      auto_mutex::~auto_mutex((auto_mutex *)0x29c78f);
      local_48 = &in_RDI[4].last_pos;
      local_50._M_current =
           (thread *)
           std::vector<std::thread,_std::allocator<std::thread>_>::begin
                     ((vector<std::thread,_std::allocator<std::thread>_> *)
                      CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      std::vector<std::thread,_std::allocator<std::thread>_>::end
                ((vector<std::thread,_std::allocator<std::thread>_> *)
                 CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                 *)in_stack_ffffffffffffff60,
                                (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                 *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58)),
            bVar2) {
        in_stack_ffffffffffffffa0 =
             (task_state_type *)
             __gnu_cxx::
             __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
             ::operator*(&local_50);
        std::thread::join();
        __gnu_cxx::
        __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
        operator++(&local_50);
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::clear
                ((vector<std::thread,_std::allocator<std::thread>_> *)0x29c808);
      local_70 = array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
                 ::begin(in_RDI);
      ptVar4 = array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
               ::end(in_RDI);
      for (; local_70 != ptVar4; local_70 = local_70 + 1) {
        task_state_type::propagate_exception(in_stack_ffffffffffffffa0);
      }
      return;
    }
    local_21 = 0;
    for (local_30 = (array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
                     *)0x0; paVar1 = local_30,
        paVar3 = (array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
                  *)array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
                    ::size(in_RDI), paVar1 < paVar3;
        local_30 = (array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
                    *)((long)&(local_30->
                              super_enumerable<dlib::thread_pool_implementation::task_state_type>).
                              _vptr_enumerable + 1)) {
      __stat_loc = local_30;
      in_stack_ffffffffffffff60 =
           array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
           ::operator[](in_RDI,(size_t)local_30);
      in_stack_ffffffffffffff5f = task_state_type::is_empty(in_stack_ffffffffffffff60);
      if (!(bool)in_stack_ffffffffffffff5f) {
        local_21 = 1;
        break;
      }
    }
    if ((local_21 & 1) != 0) {
      signaler::wait((signaler *)&in_RDI[2].pos,__stat_loc);
    }
  } while( true );
}

Assistant:

void thread_pool_implementation::
    shutdown_pool (
    )
    {
        {
            auto_mutex M(m);
            
            // first wait for all pending tasks to finish
            bool found_task = true;
            while (found_task)
            {
                found_task = false;
                for (unsigned long i = 0; i < tasks.size(); ++i)
                {
                    // If task bucket i has a task that is currently supposed to be processed
                    if (tasks[i].is_empty() == false)
                    {
                        found_task = true;
                        break;
                    }
                }

                if (found_task)
                    task_done_signaler.wait();
            }

            // now tell the threads to kill themselves
            we_are_destructing = true;
            task_ready_signaler.broadcast();
        }

        // wait for all threads to terminate
        for (auto& t : threads)
            t.join();
        threads.clear();

        // Throw any unhandled exceptions.  Since shutdown_pool() is only called in the
        // destructor this will kill the program.
        for (auto&& task : tasks)
            task.propagate_exception();
    }